

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer_init(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  uv_loop_t *loop;
  uint64_t eval_b;
  uint64_t eval_a;
  uv_timer_t handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&eval_a);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c"
            ,0xa2,"0 == uv_timer_init(uv_default_loop(), &handle)");
    abort();
  }
  lVar3 = uv_timer_get_repeat(&eval_a);
  if (lVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c"
            ,0xa3,"0 == uv_timer_get_repeat(&handle)");
    abort();
  }
  uv_timer_get_due_in(&eval_a);
  iVar1 = uv_is_active(&eval_a);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c"
            ,0xa5,"0 == uv_is_active((uv_handle_t*) &handle)");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c",
          0xa7,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(timer_init) {
  uv_timer_t handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &handle));
  ASSERT(0 == uv_timer_get_repeat(&handle));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&handle));
  ASSERT(0 == uv_is_active((uv_handle_t*) &handle));

  MAKE_VALGRIND_HAPPY();
  return 0;
}